

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

void CTcTokenizer::skip_ws_and_markers(utf8_ptr *p)

{
  byte bVar1;
  wchar_t wVar2;
  int iVar3;
  byte *p_00;
  
  p_00 = (byte *)p->p_;
  do {
    wVar2 = utf8_ptr::s_getch((char *)p_00);
    if (wVar2 == L'\x03') {
      p_00 = (byte *)(p->p_ + 9);
    }
    else {
      if (0x7f < (uint)wVar2) {
        return;
      }
      iVar3 = isspace(wVar2);
      if (iVar3 == 0) {
        return;
      }
      bVar1 = *p->p_;
      p_00 = (byte *)(p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1);
    }
    p->p_ = (char *)p_00;
  } while( true );
}

Assistant:

void CTcTokenizer::skip_ws_and_markers(utf8_ptr *p)
{
    /* keep going until we find something interesting */
    for (;;)
    {
        wchar_t cur;

        /* get the current character */
        cur = p->getch();

        /* 
         *   if it's a macro expansion end marker, skip it as though it
         *   were whitespace; otherwise, if it's whitespace, skip it;
         *   otherwise, we're done skipping leading whitespace 
         */
        if (cur == TOK_MACRO_EXP_END)
        {
            /* skip the embedded pointer value that follows */
            p->set(p->getptr() + 1 + sizeof(CTcHashEntryPp *));
        }
        else if (is_space(cur))
        {
            /* skip the space */
            p->inc();
        }
        else
        {
            /* it's not whitespace or equivalent - we're done */
            return;
        }
    }
}